

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Iterator * leveldb::GetFileIterator(void *arg,ReadOptions *options,Slice *file_value)

{
  size_t sVar1;
  char *pcVar2;
  ReadOptions *in_RDX;
  TableCache *in_RSI;
  uint64_t in_RDI;
  TableCache *cache;
  char *in_stack_ffffffffffffff98;
  Slice *in_stack_ffffffffffffffa0;
  Slice *in_stack_ffffffffffffffa8;
  Slice local_50;
  Table **in_stack_ffffffffffffffc8;
  uint64_t in_stack_ffffffffffffffd0;
  Iterator *local_8;
  
  sVar1 = Slice::size((Slice *)in_RDX);
  if (sVar1 == 0x10) {
    pcVar2 = Slice::data((Slice *)in_RDX);
    DecodeFixed64(pcVar2);
    pcVar2 = Slice::data((Slice *)in_RDX);
    DecodeFixed64(pcVar2 + 8);
    local_8 = TableCache::NewIterator
                        (in_RSI,in_RDX,in_RDI,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    Slice::Slice(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Slice::Slice(&local_50);
    Status::Corruption(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    local_8 = NewErrorIterator((Status *)in_stack_ffffffffffffffa0);
    Status::~Status((Status *)in_stack_ffffffffffffffa0);
  }
  return local_8;
}

Assistant:

static Iterator* GetFileIterator(void* arg, const ReadOptions& options,
                                 const Slice& file_value) {
  TableCache* cache = reinterpret_cast<TableCache*>(arg);
  if (file_value.size() != 16) {
    return NewErrorIterator(
        Status::Corruption("FileReader invoked with unexpected value"));
  } else {
    return cache->NewIterator(options, DecodeFixed64(file_value.data()),
                              DecodeFixed64(file_value.data() + 8));
  }
}